

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

char ctemplate_htmlparser::jsparser_buffer_get(jsparser_ctx *js,int pos)

{
  char cVar1;
  uint uVar2;
  
  if (pos < 0) {
    uVar2 = jsparser_buffer_absolute_pos(js,pos);
    if ((int)uVar2 < 0) {
      cVar1 = '\0';
    }
    else {
      cVar1 = js->buffer[uVar2];
    }
    return cVar1;
  }
  __assert_fail("pos < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x106,"char ctemplate_htmlparser::jsparser_buffer_get(jsparser_ctx *, int)");
}

Assistant:

char jsparser_buffer_get(jsparser_ctx *js, int pos)
{
  int absolute_pos;
  assert(pos < 0);

  absolute_pos = jsparser_buffer_absolute_pos(js, pos);
  if (absolute_pos < 0) {
    return '\0';
  }

  return js->buffer[absolute_pos];
}